

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointTriface.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChLinkPointTrifaceRot::ChLinkPointTrifaceRot(ChLinkPointTrifaceRot *this)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [56];
  undefined1 auVar3 [64];
  
  ChObj::ChObj((ChObj *)this);
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  *(undefined1 (*) [32])
   ((long)&(this->super_ChLinkBase).super_ChPhysicsItem.cameras.
           super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = auVar1;
  (this->super_ChLinkBase).super_ChPhysicsItem.system = (ChSystem *)auVar1._0_8_;
  (this->super_ChLinkBase).super_ChPhysicsItem.vis_model_instance =
       (shared_ptr<chrono::ChVisualModelInstance>)auVar1._8_16_;
  (this->super_ChLinkBase).super_ChPhysicsItem.cameras.
  super__Vector_base<std::shared_ptr<chrono::ChCamera>,_std::allocator<std::shared_ptr<chrono::ChCamera>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar1._24_8_;
  *(undefined2 *)&(this->super_ChLinkBase).super_ChPhysicsItem.field_0x74 = 0x100;
  (this->super_ChLinkBase).super_ChPhysicsItem.field_0x76 = 0;
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLinkPointTrifaceRot_00b50d60;
  (this->react).m_data[0] = VNULL;
  (this->react).m_data[1] = DAT_00b90ac0;
  (this->react).m_data[2] = DAT_00b90ac8;
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  (this->constraint1).super_ChConstraint.c_i = (double)auVar1._0_8_;
  (this->constraint1).super_ChConstraint.l_i = (double)auVar1._8_8_;
  (this->constraint1).super_ChConstraint.b_i = (double)auVar1._16_8_;
  (this->constraint1).super_ChConstraint.cfm_i = (double)auVar1._24_8_;
  (this->constraint1).super_ChConstraint.valid = false;
  (this->constraint1).super_ChConstraint.disabled = false;
  (this->constraint1).super_ChConstraint.redundant = false;
  (this->constraint1).super_ChConstraint.broken = false;
  (this->constraint1).super_ChConstraint.active = true;
  (this->constraint1).super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->constraint1).super_ChConstraint.g_i = 0.0;
  (this->constraint1).super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintTwoTuples_00b511e8;
  auVar3 = ZEXT864(0) << 0x20;
  (this->constraint1).tuple_b.Cq_1 =
       (ChRowVectorN<double,_ChVariableTupleCarrier_3vars<6,_6,_6>::nvars1>)auVar3._0_48_;
  (this->constraint1).tuple_b.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
  m_storage.m_data.array[0] = (double)auVar3._48_8_;
  (this->constraint1).tuple_b.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
  m_storage.m_data.array[1] = (double)auVar3._56_8_;
  *(undefined1 (*) [64])
   ((long)(this->constraint1).tuple_b.Cq_2.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array + 0x10
   ) = auVar3;
  *(undefined1 (*) [64])
   ((long)(this->constraint1).tuple_b.Cq_2.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array + 0x20
   ) = auVar3;
  auVar2 = auVar3._0_56_;
  (this->constraint1).tuple_a.variables = (ChVariables *)auVar2._0_8_;
  (this->constraint1).tuple_a.Cq =
       (ChRowVectorN<double,_ChVariableTupleCarrier_1vars<3>::nvars1>)auVar2._8_24_;
  (this->constraint1).tuple_a.Eq =
       (ChVectorN<double,_ChVariableTupleCarrier_1vars<3>::nvars1>)auVar2._32_24_;
  (this->constraint1).tuple_b.variables_1 = (ChVariables *)auVar3._56_8_;
  *(undefined1 (*) [64])
   ((long)(this->constraint1).tuple_a.Cq.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 8) =
       auVar3;
  (this->constraint2).super_ChConstraint.c_i = (double)auVar1._0_8_;
  (this->constraint2).super_ChConstraint.l_i = (double)auVar1._8_8_;
  (this->constraint2).super_ChConstraint.b_i = (double)auVar1._16_8_;
  (this->constraint2).super_ChConstraint.cfm_i = (double)auVar1._24_8_;
  (this->constraint2).super_ChConstraint.valid = false;
  (this->constraint2).super_ChConstraint.disabled = false;
  (this->constraint2).super_ChConstraint.redundant = false;
  (this->constraint2).super_ChConstraint.broken = false;
  (this->constraint2).super_ChConstraint.active = true;
  (this->constraint2).super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->constraint2).super_ChConstraint.g_i = 0.0;
  (this->constraint2).super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintTwoTuples_00b511e8;
  *(undefined1 (*) [64])
   ((long)(this->constraint2).tuple_b.Cq_2.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array + 0x20
   ) = auVar3;
  *(undefined1 (*) [64])
   ((long)(this->constraint2).tuple_b.Cq_2.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array + 0x10
   ) = auVar3;
  (this->constraint2).tuple_b.Cq_1 =
       (ChRowVectorN<double,_ChVariableTupleCarrier_3vars<6,_6,_6>::nvars1>)auVar3._0_48_;
  (this->constraint2).tuple_b.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
  m_storage.m_data.array[0] = (double)auVar3._48_8_;
  (this->constraint2).tuple_b.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
  m_storage.m_data.array[1] = (double)auVar3._56_8_;
  *(undefined1 (*) [64])
   ((long)(this->constraint2).tuple_a.Cq.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 8) =
       auVar3;
  auVar2 = auVar3._0_56_;
  (this->constraint2).tuple_a.variables = (ChVariables *)auVar2._0_8_;
  (this->constraint2).tuple_a.Cq =
       (ChRowVectorN<double,_ChVariableTupleCarrier_1vars<3>::nvars1>)auVar2._8_24_;
  (this->constraint2).tuple_a.Eq =
       (ChVectorN<double,_ChVariableTupleCarrier_1vars<3>::nvars1>)auVar2._32_24_;
  (this->constraint2).tuple_b.variables_1 = (ChVariables *)auVar3._56_8_;
  (this->constraint3).super_ChConstraint.valid = false;
  (this->constraint3).super_ChConstraint.disabled = false;
  (this->constraint3).super_ChConstraint.redundant = false;
  (this->constraint3).super_ChConstraint.broken = false;
  (this->constraint3).super_ChConstraint.c_i = (double)auVar1._0_8_;
  (this->constraint3).super_ChConstraint.l_i = (double)auVar1._8_8_;
  (this->constraint3).super_ChConstraint.b_i = (double)auVar1._16_8_;
  (this->constraint3).super_ChConstraint.cfm_i = (double)auVar1._24_8_;
  (this->constraint3).super_ChConstraint.active = true;
  (this->constraint3).super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->constraint3).super_ChConstraint.g_i = 0.0;
  (this->constraint3).super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintTwoTuples_00b511e8;
  *(undefined1 (*) [64])
   ((long)(this->constraint3).tuple_b.Cq_2.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array + 0x20
   ) = auVar3;
  *(undefined1 (*) [64])
   ((long)(this->constraint3).tuple_b.Cq_2.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.m_data.array + 0x10
   ) = auVar3;
  (this->constraint3).tuple_b.Cq_1 =
       (ChRowVectorN<double,_ChVariableTupleCarrier_3vars<6,_6,_6>::nvars1>)auVar3._0_48_;
  (this->constraint3).tuple_b.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
  m_storage.m_data.array[0] = (double)auVar3._48_8_;
  (this->constraint3).tuple_b.Cq_2.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
  m_storage.m_data.array[1] = (double)auVar3._56_8_;
  auVar2 = auVar3._0_56_;
  (this->constraint3).tuple_a.variables = (ChVariables *)auVar2._0_8_;
  (this->constraint3).tuple_a.Cq =
       (ChRowVectorN<double,_ChVariableTupleCarrier_1vars<3>::nvars1>)auVar2._8_24_;
  (this->constraint3).tuple_a.Eq =
       (ChVectorN<double,_ChVariableTupleCarrier_1vars<3>::nvars1>)auVar2._32_24_;
  (this->constraint3).tuple_b.variables_1 = (ChVariables *)auVar3._56_8_;
  *(undefined1 (*) [64])
   ((long)(this->constraint3).tuple_a.Cq.
          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 8) =
       auVar3;
  (this->mnodeA).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)(ZEXT416(0) << 0x40);
  (this->mtriangle).super_ChVariableTupleCarrier_3vars<6,_6,_6>._vptr_ChVariableTupleCarrier_3vars =
       (_func_int **)&PTR__ChTriangleOfXYZROTnodes_00b51038;
  this->d = 0.0;
  *(undefined1 (*) [64])&(this->mtriangle).mnodeB1 = auVar3;
  return;
}

Assistant:

ChLinkPointTrifaceRot::ChLinkPointTrifaceRot() : react(VNULL), s2(0), s3(0), d(0) {}